

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O2

BN * gcdInverseEuclidean(BN *__return_storage_ptr__,BN *a,BN *mod)

{
  bool bVar1;
  BNsign *bn;
  BNsign x2;
  BNsign x0;
  BN A;
  BN Div;
  BN Mod;
  BN B;
  BN startMod;
  BNsign x1;
  BNsign local_168;
  BNsign local_148;
  BNsign local_128;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_108;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_f0;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_d8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_c0;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  BNsign local_90;
  BNsign local_70;
  BNsign local_50;
  
  BN::BN((BN *)&local_a8,mod);
  BN::operator%((BN *)&local_108,a,mod);
  BN::BN((BN *)&local_c0,mod);
  bVar1 = BN::is0((BN *)&local_108);
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_128.value);
    goto LAB_0010b3c9;
  }
  BNsign::BNsign(&local_128);
  BN::bn0();
  BNsign::BNsign(&local_90,&local_168.value,false);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_168);
  BN::bn1();
  BNsign::BNsign(&local_168,&local_148.value,false);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148);
  BN::BN((BN *)&local_f0);
  BN::BN((BN *)&local_d8);
  while( true ) {
    BN::divmod((BN *)&local_c0,(BN *)&local_108,(BN *)&local_f0,(BN *)&local_d8);
    bVar1 = BN::is0((BN *)&local_d8);
    if (bVar1) break;
    BNsign::operator=(&local_128,&local_90);
    BNsign::operator=(&local_90,&local_168);
    BNsign::BNsign(&local_70,(BN *)&local_f0,false);
    BNsign::operator*(&local_50,&local_90,&local_70);
    BNsign::operator-(&local_148,&local_128,&local_50);
    BNsign::operator=(&local_168,&local_148);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_50);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_70);
    BN::operator=((BN *)&local_c0,(BN *)&local_108);
    BN::operator=((BN *)&local_108,(BN *)&local_d8);
  }
  BN::bn1();
  bVar1 = BN::operator!=((BN *)&local_108,&local_148.value);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148);
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_148.value);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148);
  }
  else {
    if (local_168.sign == true) {
      bVar1 = BN::is0(&local_168.value);
      if (bVar1) goto LAB_0010b371;
      bn = (BNsign *)BN::operator-=((BN *)&local_a8,&local_168.value);
    }
    else {
LAB_0010b371:
      bn = &local_168;
    }
    BN::BN(__return_storage_ptr__,&bn->value);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_d8);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_f0);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_168);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_90);
LAB_0010b3c9:
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_128);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_c0);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_108);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

BN gcdInverseEuclidean(const BN& a, const BN& mod)
{
    BN startMod(mod);

    BN A(a % mod);
    BN B(mod);

    if(A.is0())
        return move(BN::bn0());

    BNsign x0;
    BNsign x1(BN::bn0());
    BNsign x2(BN::bn1());
    BN Div;
    BN Mod;
    while (true) {
        B.divmod(A, Div, Mod);
        if (Mod.is0())
            break;
        x0 = move(x1);
        x1 = move(x2);

        x2 = x0 - x1 * (BNsign)Div;

        B = move(A);
        A = move(Mod);
    }

    if(A != BN::bn1())
        return move(BN::bn0());
    if(x2.sign && !x2.value.is0())
        return move(startMod -= x2.value);
    return move(x2.value);
}